

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O2

void sd_add_seq(kseq_t *seq,int file,int use_header)

{
  long *plVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  int iVar6;
  size_t sVar7;
  byte *pbVar8;
  sd_lookup_t *psVar9;
  char *__dest;
  char *__dest_00;
  char *__dest_01;
  UT_hash_table *pUVar10;
  UT_hash_bucket *pUVar11;
  uint uVar12;
  uint uVar13;
  UT_hash_handle *pUVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  UT_hash_bucket *__ptr;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  UT_hash_handle *pUVar21;
  uint uVar22;
  long lVar23;
  size_t sStack_50;
  sd_lookup_t *local_40;
  
  local_40 = sd_lookup;
  if (use_header == 0) {
    if (sd_lookup == (sd_lookup_t *)0x0) goto LAB_0010200b;
    pcVar18 = (seq->seq).s;
    sVar7 = strlen(pcVar18);
    pbVar8 = (byte *)(pcVar18 + 10);
    uVar12 = 0xfeedbeef;
    uVar15 = 0x9e3779b9;
    uVar19 = 0x9e3779b9;
    uVar17 = sVar7 & 0xffffffff;
    while (uVar16 = (uint)uVar17, 0xb < uVar16) {
      uVar12 = uVar12 + *(int *)(pbVar8 + -2);
      uVar19 = uVar12 >> 0xd ^
               ((uVar19 + *(int *)(pbVar8 + -10)) - (uVar15 + *(int *)(pbVar8 + -6))) - uVar12;
      uVar15 = uVar19 << 8 ^ ((uVar15 + *(int *)(pbVar8 + -6)) - uVar12) - uVar19;
      uVar12 = uVar15 >> 0xd ^ (uVar12 - uVar19) - uVar15;
      uVar19 = uVar12 >> 0xc ^ (uVar19 - uVar15) - uVar12;
      uVar15 = uVar19 << 0x10 ^ (uVar15 - uVar12) - uVar19;
      uVar12 = uVar15 >> 5 ^ (uVar12 - uVar19) - uVar15;
      uVar19 = uVar12 >> 3 ^ (uVar19 - uVar15) - uVar12;
      uVar15 = uVar19 << 10 ^ (uVar15 - uVar12) - uVar19;
      uVar12 = uVar15 >> 0xf ^ (uVar12 - uVar19) - uVar15;
      pbVar8 = pbVar8 + 0xc;
      uVar17 = (ulong)(uVar16 - 0xc);
    }
    uVar12 = uVar12 + (int)sVar7;
    switch(uVar16) {
    case 0xb:
      uVar12 = (uint)*pbVar8 * 0x1000000 + uVar12;
    case 10:
      uVar12 = (uint)pbVar8[-1] * 0x10000 + uVar12;
    case 9:
      uVar12 = (uint)pbVar8[-2] * 0x100 + uVar12;
    case 8:
      uVar15 = (uint)pbVar8[-3] * 0x1000000 + uVar15;
    case 7:
      uVar15 = (uint)pbVar8[-4] * 0x10000 + uVar15;
    case 6:
      uVar15 = (uint)pbVar8[-5] * 0x100 + uVar15;
    case 5:
      uVar15 = pbVar8[-6] + uVar15;
    case 4:
      uVar19 = (uint)pbVar8[-7] * 0x1000000 + uVar19;
    case 3:
      uVar19 = (uint)pbVar8[-8] * 0x10000 + uVar19;
    case 2:
      uVar19 = (uint)pbVar8[-9] * 0x100 + uVar19;
    case 1:
      uVar19 = pbVar8[-10] + uVar19;
    default:
      uVar19 = uVar12 >> 0xd ^ (uVar19 - uVar15) - uVar12;
      uVar16 = uVar19 << 8 ^ (uVar15 - uVar12) - uVar19;
      uVar15 = uVar16 >> 0xd ^ (uVar12 - uVar19) - uVar16;
      uVar12 = uVar15 >> 0xc ^ (uVar19 - uVar16) - uVar15;
      uVar19 = uVar12 << 0x10 ^ (uVar16 - uVar15) - uVar12;
      uVar15 = uVar19 >> 5 ^ (uVar15 - uVar12) - uVar19;
      uVar12 = uVar15 >> 3 ^ (uVar12 - uVar19) - uVar15;
      uVar19 = uVar12 << 10 ^ (uVar19 - uVar15) - uVar12;
      pUVar10 = (local_40->hh).tbl;
      pUVar14 = pUVar10->buckets
                [pUVar10->num_buckets - 1 & (uVar19 >> 0xf ^ uVar15 - (uVar12 + uVar19))].hh_head;
      if (pUVar14 == (UT_hash_handle *)0x0) {
        lVar23 = 0;
      }
      else {
        lVar23 = (long)pUVar14 - pUVar10->hho;
      }
    }
    while (lVar23 != 0) {
      if ((sVar7 == *(uint *)(lVar23 + 0x58)) &&
         (iVar6 = bcmp(*(void **)(lVar23 + 0x50),pcVar18,sVar7), iVar6 == 0)) goto LAB_0010235b;
      plVar1 = (long *)(lVar23 + 0x48);
      lVar23 = 0;
      if (*plVar1 != 0) {
        lVar23 = *plVar1 - pUVar10->hho;
      }
    }
LAB_001021b8:
  }
  else {
    if (sd_lookup != (sd_lookup_t *)0x0) {
      pcVar18 = (seq->name).s;
      sVar7 = strlen(pcVar18);
      pbVar8 = (byte *)(pcVar18 + 10);
      uVar12 = 0xfeedbeef;
      uVar15 = 0x9e3779b9;
      uVar19 = 0x9e3779b9;
      uVar17 = sVar7 & 0xffffffff;
      while (uVar16 = (uint)uVar17, 0xb < uVar16) {
        uVar12 = uVar12 + *(int *)(pbVar8 + -2);
        uVar19 = uVar12 >> 0xd ^
                 ((uVar19 + *(int *)(pbVar8 + -10)) - (uVar15 + *(int *)(pbVar8 + -6))) - uVar12;
        uVar15 = uVar19 << 8 ^ ((uVar15 + *(int *)(pbVar8 + -6)) - uVar12) - uVar19;
        uVar12 = uVar15 >> 0xd ^ (uVar12 - uVar19) - uVar15;
        uVar19 = uVar12 >> 0xc ^ (uVar19 - uVar15) - uVar12;
        uVar15 = uVar19 << 0x10 ^ (uVar15 - uVar12) - uVar19;
        uVar12 = uVar15 >> 5 ^ (uVar12 - uVar19) - uVar15;
        uVar19 = uVar12 >> 3 ^ (uVar19 - uVar15) - uVar12;
        uVar15 = uVar19 << 10 ^ (uVar15 - uVar12) - uVar19;
        uVar12 = uVar15 >> 0xf ^ (uVar12 - uVar19) - uVar15;
        pbVar8 = pbVar8 + 0xc;
        uVar17 = (ulong)(uVar16 - 0xc);
      }
      uVar12 = uVar12 + (int)sVar7;
      switch(uVar16) {
      case 0xb:
        uVar12 = (uint)*pbVar8 * 0x1000000 + uVar12;
      case 10:
        uVar12 = (uint)pbVar8[-1] * 0x10000 + uVar12;
      case 9:
        uVar12 = (uint)pbVar8[-2] * 0x100 + uVar12;
      case 8:
        uVar15 = (uint)pbVar8[-3] * 0x1000000 + uVar15;
      case 7:
        uVar15 = (uint)pbVar8[-4] * 0x10000 + uVar15;
      case 6:
        uVar15 = (uint)pbVar8[-5] * 0x100 + uVar15;
      case 5:
        uVar15 = pbVar8[-6] + uVar15;
      case 4:
        uVar19 = (uint)pbVar8[-7] * 0x1000000 + uVar19;
      case 3:
        uVar19 = (uint)pbVar8[-8] * 0x10000 + uVar19;
      case 2:
        uVar19 = (uint)pbVar8[-9] * 0x100 + uVar19;
      case 1:
        uVar19 = pbVar8[-10] + uVar19;
      default:
        uVar19 = uVar12 >> 0xd ^ (uVar19 - uVar15) - uVar12;
        uVar16 = uVar19 << 8 ^ (uVar15 - uVar12) - uVar19;
        uVar15 = uVar16 >> 0xd ^ (uVar12 - uVar19) - uVar16;
        uVar12 = uVar15 >> 0xc ^ (uVar19 - uVar16) - uVar15;
        uVar19 = uVar12 << 0x10 ^ (uVar16 - uVar15) - uVar12;
        uVar15 = uVar19 >> 5 ^ (uVar15 - uVar12) - uVar19;
        uVar12 = uVar15 >> 3 ^ (uVar12 - uVar19) - uVar15;
        uVar19 = uVar12 << 10 ^ (uVar19 - uVar15) - uVar12;
        pUVar10 = (local_40->hh).tbl;
        pUVar14 = pUVar10->buckets
                  [pUVar10->num_buckets - 1 & (uVar19 >> 0xf ^ uVar15 - (uVar12 + uVar19))].hh_head;
        if (pUVar14 == (UT_hash_handle *)0x0) {
          lVar23 = 0;
        }
        else {
          lVar23 = (long)pUVar14 - pUVar10->hho;
        }
      }
      while (lVar23 != 0) {
        if ((sVar7 == *(uint *)(lVar23 + 0x58)) &&
           (iVar6 = bcmp(*(void **)(lVar23 + 0x50),pcVar18,sVar7), iVar6 == 0)) {
LAB_0010235b:
          *(int *)(lVar23 + 0x18) = *(int *)(lVar23 + 0x18) + 1;
          if (file == 2) {
            *(undefined4 *)(lVar23 + 0x20) = 1;
            return;
          }
          if (file != 1) {
            return;
          }
          *(undefined4 *)(lVar23 + 0x1c) = 1;
          return;
        }
        plVar1 = (long *)(lVar23 + 0x48);
        lVar23 = 0;
        if (*plVar1 != 0) {
          lVar23 = *plVar1 - pUVar10->hho;
        }
      }
      goto LAB_001021b8;
    }
LAB_0010200b:
    local_40 = (sd_lookup_t *)0x0;
  }
  psVar9 = (sd_lookup_t *)malloc(0x60);
  if (psVar9 == (sd_lookup_t *)0x0) {
    pcVar18 = "couldn\'t get memory for sd_lookup_t\n";
LAB_00102aa3:
    sStack_50 = 0x24;
  }
  else {
    psVar9->seq = (char *)0x0;
    psVar9->name = (char *)0x0;
    psVar9->count = 1;
    psVar9->in_a = 0;
    psVar9->in_b = 0;
    pcVar18 = (seq->seq).s;
    sVar7 = strlen(pcVar18);
    __dest = (char *)malloc(sVar7 * 8 + 8);
    psVar9->seq = __dest;
    if (__dest != (char *)0x0) {
      sVar7 = strlen(pcVar18);
      strncpy(__dest,pcVar18,sVar7 + 1);
      pcVar18 = (seq->name).s;
      sVar7 = strlen(pcVar18);
      __dest_00 = (char *)malloc(sVar7 * 8 + 8);
      psVar9->name = __dest_00;
      if (__dest_00 != (char *)0x0) {
        sVar7 = strlen(pcVar18);
        strncpy(__dest_00,pcVar18,sVar7 + 1);
        pcVar18 = (seq->comment).s;
        if (pcVar18 == (char *)0x0) {
          psVar9->comment = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar18);
          __dest_01 = (char *)malloc(sVar7 * 8 + 8);
          psVar9->comment = __dest_01;
          if (__dest_01 == (char *)0x0) {
            pcVar18 = "couldn\'t get memory for comment string\n";
            sStack_50 = 0x27;
            goto LAB_00102abe;
          }
          sVar7 = strlen(pcVar18);
          strncpy(__dest_01,pcVar18,sVar7 + 1);
        }
        if (file == 2) {
          psVar9->in_b = 1;
        }
        else if (file == 1) {
          psVar9->in_a = 1;
        }
        (psVar9->hh).next = (void *)0x0;
        pUVar14 = &psVar9->hh;
        if (use_header == 0) {
          (psVar9->hh).key = __dest;
          sVar7 = strlen(__dest);
          (psVar9->hh).keylen = (uint)sVar7;
          if (local_40 == (sd_lookup_t *)0x0) {
            sd_lookup = psVar9;
            (psVar9->hh).prev = (void *)0x0;
            pUVar10 = (UT_hash_table *)calloc(1,0x40);
            (psVar9->hh).tbl = pUVar10;
            if (pUVar10 != (UT_hash_table *)0x0) {
              pUVar10->tail = pUVar14;
              pUVar10->num_buckets = 0x20;
              pUVar10->log2_num_buckets = 5;
              pUVar10->hho = 0x28;
              pUVar11 = (UT_hash_bucket *)calloc(1,0x200);
              pUVar10->buckets = pUVar11;
              if (pUVar11 != (UT_hash_bucket *)0x0) {
                pUVar10->signature = 0xa0111fe1;
                local_40 = psVar9;
                goto LAB_00102727;
              }
            }
          }
          else {
            pUVar10 = (local_40->hh).tbl;
            pUVar21 = pUVar10->tail;
            pUVar21->next = psVar9;
            (psVar9->hh).prev = (void *)((long)pUVar21 - pUVar10->hho);
            pUVar10->tail = pUVar14;
LAB_00102727:
            uVar16 = pUVar10->num_items + 1;
            pUVar10->num_items = uVar16;
            (psVar9->hh).tbl = pUVar10;
            sVar7 = strlen(__dest);
            pbVar8 = (byte *)(__dest + 10);
            uVar15 = 0x9e3779b9;
            uVar19 = 0xfeedbeef;
            uVar12 = 0x9e3779b9;
            uVar17 = sVar7 & 0xffffffff;
            while (uVar13 = (uint)uVar17, 0xb < uVar13) {
              uVar19 = uVar19 + *(int *)(pbVar8 + -2);
              uVar20 = uVar19 >> 0xd ^
                       ((uVar15 + *(int *)(pbVar8 + -10)) - (uVar12 + *(int *)(pbVar8 + -6))) -
                       uVar19;
              uVar15 = uVar20 << 8 ^ ((uVar12 + *(int *)(pbVar8 + -6)) - uVar19) - uVar20;
              uVar12 = uVar15 >> 0xd ^ (uVar19 - uVar20) - uVar15;
              uVar19 = uVar12 >> 0xc ^ (uVar20 - uVar15) - uVar12;
              uVar20 = uVar19 << 0x10 ^ (uVar15 - uVar12) - uVar19;
              uVar22 = uVar20 >> 5 ^ (uVar12 - uVar19) - uVar20;
              uVar15 = uVar22 >> 3 ^ (uVar19 - uVar20) - uVar22;
              uVar12 = uVar15 << 10 ^ (uVar20 - uVar22) - uVar15;
              uVar19 = uVar12 >> 0xf ^ (uVar22 - uVar15) - uVar12;
              (psVar9->hh).hashv = uVar19;
              pbVar8 = pbVar8 + 0xc;
              uVar17 = (ulong)(uVar13 - 0xc);
            }
            uVar19 = uVar19 + (int)sVar7;
            switch(uVar13) {
            case 0xb:
              uVar19 = (uint)*pbVar8 * 0x1000000 + uVar19;
            case 10:
              uVar19 = (uint)pbVar8[-1] * 0x10000 + uVar19;
            case 9:
              uVar19 = (uint)pbVar8[-2] * 0x100 + uVar19;
              (psVar9->hh).hashv = uVar19;
            case 8:
              uVar12 = (uint)pbVar8[-3] * 0x1000000 + uVar12;
            case 7:
              uVar12 = (uint)pbVar8[-4] * 0x10000 + uVar12;
            case 6:
              uVar12 = (uint)pbVar8[-5] * 0x100 + uVar12;
            case 5:
              uVar12 = pbVar8[-6] + uVar12;
            case 4:
              uVar15 = (uint)pbVar8[-7] * 0x1000000 + uVar15;
            case 3:
              uVar15 = (uint)pbVar8[-8] * 0x10000 + uVar15;
            case 2:
              uVar15 = (uint)pbVar8[-9] * 0x100 + uVar15;
            case 1:
              uVar15 = pbVar8[-10] + uVar15;
            }
            uVar15 = uVar19 >> 0xd ^ (uVar15 - uVar12) - uVar19;
            uVar20 = uVar15 << 8 ^ (uVar12 - uVar19) - uVar15;
            uVar13 = uVar20 >> 0xd ^ (uVar19 - uVar15) - uVar20;
            uVar12 = uVar13 >> 0xc ^ (uVar15 - uVar20) - uVar13;
            uVar19 = uVar12 << 0x10 ^ (uVar20 - uVar13) - uVar12;
            uVar15 = uVar19 >> 5 ^ (uVar13 - uVar12) - uVar19;
            uVar12 = uVar15 >> 3 ^ (uVar12 - uVar19) - uVar15;
            uVar19 = uVar12 << 10 ^ (uVar19 - uVar15) - uVar12;
            uVar19 = uVar19 >> 0xf ^ uVar15 - (uVar12 + uVar19);
            (psVar9->hh).hashv = uVar19;
            pUVar3 = (local_40->hh).tbl;
            uVar19 = pUVar3->num_buckets - 1 & uVar19;
            pUVar11 = pUVar3->buckets;
            pUVar11[uVar19].count = pUVar11[uVar19].count + 1;
            pUVar21 = pUVar11[uVar19].hh_head;
            (psVar9->hh).hh_next = pUVar21;
            (psVar9->hh).hh_prev = (UT_hash_handle *)0x0;
            if (pUVar21 != (UT_hash_handle *)0x0) {
              pUVar21->hh_prev = pUVar14;
            }
            pUVar11[uVar19].hh_head = pUVar14;
            pUVar11 = ((sd_lookup->hh).tbl)->buckets;
            if (pUVar11[uVar19].count < pUVar11[uVar19].expand_mult * 10 + 10) {
              return;
            }
            if (pUVar10->noexpand == 1) {
              return;
            }
            uVar19 = pUVar10->num_buckets;
            uVar12 = uVar19 * 2;
            pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)uVar12 << 4);
            if (pUVar11 != (UT_hash_bucket *)0x0) {
              uVar12 = uVar12 - 1;
              uVar16 = ((uVar16 >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
                       (uint)((uVar12 & uVar16) == 0);
              pUVar10->ideal_chain_maxlen = uVar16;
              pUVar10->nonideal_items = 0;
              __ptr = pUVar10->buckets;
              uVar15 = 0;
              for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
                pUVar21 = __ptr[uVar17].hh_head;
                while (pUVar21 != (UT_hash_handle *)0x0) {
                  pUVar4 = pUVar21->hh_next;
                  uVar20 = pUVar21->hashv & uVar12;
                  pUVar2 = pUVar11 + uVar20;
                  uVar13 = pUVar11[uVar20].count + 1;
                  pUVar11[uVar20].count = uVar13;
                  if (uVar16 < uVar13) {
                    uVar15 = uVar15 + 1;
                    pUVar10->nonideal_items = uVar15;
                    pUVar2->expand_mult = uVar13 / uVar16;
                  }
                  pUVar21->hh_prev = (UT_hash_handle *)0x0;
                  pUVar5 = pUVar2->hh_head;
                  pUVar21->hh_next = pUVar5;
                  if (pUVar5 != (UT_hash_handle *)0x0) {
                    pUVar5->hh_prev = pUVar21;
                  }
                  pUVar2->hh_head = pUVar21;
                  pUVar21 = pUVar4;
                }
              }
              goto LAB_00102a1b;
            }
          }
        }
        else {
          (psVar9->hh).key = __dest_00;
          sVar7 = strlen(__dest_00);
          (psVar9->hh).keylen = (uint)sVar7;
          if (local_40 == (sd_lookup_t *)0x0) {
            sd_lookup = psVar9;
            (psVar9->hh).prev = (void *)0x0;
            pUVar10 = (UT_hash_table *)calloc(1,0x40);
            (psVar9->hh).tbl = pUVar10;
            if (pUVar10 != (UT_hash_table *)0x0) {
              pUVar10->tail = pUVar14;
              pUVar10->num_buckets = 0x20;
              pUVar10->log2_num_buckets = 5;
              pUVar10->hho = 0x28;
              pUVar11 = (UT_hash_bucket *)calloc(1,0x200);
              pUVar10->buckets = pUVar11;
              if (pUVar11 != (UT_hash_bucket *)0x0) {
                pUVar10->signature = 0xa0111fe1;
                local_40 = psVar9;
                goto LAB_001023df;
              }
            }
          }
          else {
            pUVar10 = (local_40->hh).tbl;
            pUVar21 = pUVar10->tail;
            pUVar21->next = psVar9;
            (psVar9->hh).prev = (void *)((long)pUVar21 - pUVar10->hho);
            pUVar10->tail = pUVar14;
LAB_001023df:
            uVar16 = pUVar10->num_items + 1;
            pUVar10->num_items = uVar16;
            (psVar9->hh).tbl = pUVar10;
            sVar7 = strlen(__dest_00);
            pbVar8 = (byte *)(__dest_00 + 10);
            uVar15 = 0x9e3779b9;
            uVar19 = 0xfeedbeef;
            uVar12 = 0x9e3779b9;
            uVar17 = sVar7 & 0xffffffff;
            while (uVar13 = (uint)uVar17, 0xb < uVar13) {
              uVar19 = uVar19 + *(int *)(pbVar8 + -2);
              uVar20 = uVar19 >> 0xd ^
                       ((uVar15 + *(int *)(pbVar8 + -10)) - (uVar12 + *(int *)(pbVar8 + -6))) -
                       uVar19;
              uVar15 = uVar20 << 8 ^ ((uVar12 + *(int *)(pbVar8 + -6)) - uVar19) - uVar20;
              uVar12 = uVar15 >> 0xd ^ (uVar19 - uVar20) - uVar15;
              uVar19 = uVar12 >> 0xc ^ (uVar20 - uVar15) - uVar12;
              uVar20 = uVar19 << 0x10 ^ (uVar15 - uVar12) - uVar19;
              uVar22 = uVar20 >> 5 ^ (uVar12 - uVar19) - uVar20;
              uVar15 = uVar22 >> 3 ^ (uVar19 - uVar20) - uVar22;
              uVar12 = uVar15 << 10 ^ (uVar20 - uVar22) - uVar15;
              uVar19 = uVar12 >> 0xf ^ (uVar22 - uVar15) - uVar12;
              (psVar9->hh).hashv = uVar19;
              pbVar8 = pbVar8 + 0xc;
              uVar17 = (ulong)(uVar13 - 0xc);
            }
            uVar19 = uVar19 + (int)sVar7;
            switch(uVar13) {
            case 0xb:
              uVar19 = (uint)*pbVar8 * 0x1000000 + uVar19;
            case 10:
              uVar19 = (uint)pbVar8[-1] * 0x10000 + uVar19;
            case 9:
              uVar19 = (uint)pbVar8[-2] * 0x100 + uVar19;
              (psVar9->hh).hashv = uVar19;
            case 8:
              uVar12 = (uint)pbVar8[-3] * 0x1000000 + uVar12;
            case 7:
              uVar12 = (uint)pbVar8[-4] * 0x10000 + uVar12;
            case 6:
              uVar12 = (uint)pbVar8[-5] * 0x100 + uVar12;
            case 5:
              uVar12 = pbVar8[-6] + uVar12;
            case 4:
              uVar15 = (uint)pbVar8[-7] * 0x1000000 + uVar15;
            case 3:
              uVar15 = (uint)pbVar8[-8] * 0x10000 + uVar15;
            case 2:
              uVar15 = (uint)pbVar8[-9] * 0x100 + uVar15;
            case 1:
              uVar15 = pbVar8[-10] + uVar15;
            }
            uVar15 = uVar19 >> 0xd ^ (uVar15 - uVar12) - uVar19;
            uVar20 = uVar15 << 8 ^ (uVar12 - uVar19) - uVar15;
            uVar13 = uVar20 >> 0xd ^ (uVar19 - uVar15) - uVar20;
            uVar12 = uVar13 >> 0xc ^ (uVar15 - uVar20) - uVar13;
            uVar19 = uVar12 << 0x10 ^ (uVar20 - uVar13) - uVar12;
            uVar15 = uVar19 >> 5 ^ (uVar13 - uVar12) - uVar19;
            uVar12 = uVar15 >> 3 ^ (uVar12 - uVar19) - uVar15;
            uVar19 = uVar12 << 10 ^ (uVar19 - uVar15) - uVar12;
            uVar19 = uVar19 >> 0xf ^ uVar15 - (uVar12 + uVar19);
            (psVar9->hh).hashv = uVar19;
            pUVar3 = (local_40->hh).tbl;
            uVar19 = pUVar3->num_buckets - 1 & uVar19;
            pUVar11 = pUVar3->buckets;
            pUVar11[uVar19].count = pUVar11[uVar19].count + 1;
            pUVar21 = pUVar11[uVar19].hh_head;
            (psVar9->hh).hh_next = pUVar21;
            (psVar9->hh).hh_prev = (UT_hash_handle *)0x0;
            if (pUVar21 != (UT_hash_handle *)0x0) {
              pUVar21->hh_prev = pUVar14;
            }
            pUVar11[uVar19].hh_head = pUVar14;
            pUVar11 = ((sd_lookup->hh).tbl)->buckets;
            if (pUVar11[uVar19].count < pUVar11[uVar19].expand_mult * 10 + 10) {
              return;
            }
            if (pUVar10->noexpand == 1) {
              return;
            }
            uVar19 = pUVar10->num_buckets;
            uVar12 = uVar19 * 2;
            pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)uVar12 << 4);
            if (pUVar11 != (UT_hash_bucket *)0x0) {
              uVar12 = uVar12 - 1;
              uVar16 = ((uVar16 >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
                       (uint)((uVar12 & uVar16) == 0);
              pUVar10->ideal_chain_maxlen = uVar16;
              pUVar10->nonideal_items = 0;
              __ptr = pUVar10->buckets;
              uVar15 = 0;
              for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
                pUVar21 = __ptr[uVar17].hh_head;
                while (pUVar21 != (UT_hash_handle *)0x0) {
                  pUVar4 = pUVar21->hh_next;
                  uVar20 = pUVar21->hashv & uVar12;
                  pUVar2 = pUVar11 + uVar20;
                  uVar13 = pUVar11[uVar20].count + 1;
                  pUVar11[uVar20].count = uVar13;
                  if (uVar16 < uVar13) {
                    uVar15 = uVar15 + 1;
                    pUVar10->nonideal_items = uVar15;
                    pUVar2->expand_mult = uVar13 / uVar16;
                  }
                  pUVar21->hh_prev = (UT_hash_handle *)0x0;
                  pUVar5 = pUVar2->hh_head;
                  pUVar21->hh_next = pUVar5;
                  if (pUVar5 != (UT_hash_handle *)0x0) {
                    pUVar5->hh_prev = pUVar21;
                  }
                  pUVar2->hh_head = pUVar21;
                  pUVar21 = pUVar4;
                }
              }
LAB_00102a1b:
              free(__ptr);
              pUVar10 = pUVar14->tbl;
              pUVar10->num_buckets = pUVar10->num_buckets << 1;
              pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
              pUVar10->buckets = pUVar11;
              if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
                uVar19 = pUVar10->ineff_expands + 1;
                pUVar10->ineff_expands = uVar19;
                if (1 < uVar19) {
                  pUVar10->noexpand = 1;
                }
              }
              else {
                pUVar10->ineff_expands = 0;
              }
              return;
            }
          }
        }
        iVar6 = -1;
        goto LAB_00102ac9;
      }
      pcVar18 = "couldn\'t get memory for name string\n";
      goto LAB_00102aa3;
    }
    pcVar18 = "couldn\'t get memory for seq string\n";
    sStack_50 = 0x23;
  }
LAB_00102abe:
  fwrite(pcVar18,sStack_50,1,_stderr);
  iVar6 = 1;
LAB_00102ac9:
  exit(iVar6);
}

Assistant:

void sd_add_seq(kseq_t *seq, int file, int use_header)
{
	sd_lookup_t *s;

	if (use_header)
		HASH_FIND_STR(sd_lookup,seq->name.s,s);
	else
		HASH_FIND_STR(sd_lookup,seq->seq.s,s);

	if (s==NULL) { /* key is not in hash */
		s = (sd_lookup_t *)malloc(sizeof(sd_lookup_t));
		if (s == NULL) {
			fprintf(stderr,"couldn't get memory for sd_lookup_t\n");
			exit(EXIT_FAILURE);
		} else {
			/* initialize struct */
			s->seq = NULL;
			s->name = NULL;
			s->count = 1;
			s->in_a = 0;
			s->in_b = 0;
		}

		s->seq = (char *)malloc((sizeof(char*) * (strlen(seq->seq.s)+1)));
		if (s->seq == NULL) {
			fprintf(stderr,"couldn't get memory for seq string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->seq,seq->seq.s,strlen(seq->seq.s)+1);

		s->name = (char *)malloc((sizeof(char*) * (strlen(seq->name.s)+1)));
		if (s->name == NULL) {
			fprintf(stderr,"couldn't get memory for name string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->name,seq->name.s,strlen(seq->name.s)+1);

		if (seq->comment.s != NULL) {
			s->comment = (char *)malloc((sizeof(char*) * (strlen(seq->comment.s)+1)));
			if (s->comment == NULL) {
				fprintf(stderr,"couldn't get memory for comment string\n");
				exit(EXIT_FAILURE);
			} else
				strncpy(s->comment,seq->comment.s,strlen(seq->comment.s)+1);
		} else
			s->comment = NULL;

		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
		if (use_header)
			HASH_ADD_KEYPTR( hh, sd_lookup, s->name, strlen(s->name), s );
		else
			HASH_ADD_KEYPTR( hh, sd_lookup, s->seq, strlen(s->seq), s );
	} else {
		s->count++; /* key is already in the hash, just incr count */
		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
	}
}